

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_generic_trigo.hpp
# Opt level: O0

batch<float,_xsimd::avx512bw> *
xsimd::kernel::acos<xsimd::avx512bw,float>
          (batch<float,_xsimd::avx512bw> *self,requires_arch<generic> param_2)

{
  batch<float,_xsimd::avx512bw> *pbVar1;
  batch<float,_xsimd::avx512bw> *in_RDI;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  batch_bool<float,_xsimd::avx512bw> x_larger_05;
  batch_type x;
  batch<float,_xsimd::avx512bw> *in_stack_fffffffffffffa60;
  batch<float,_xsimd::avx512bw> *in_stack_fffffffffffffa68;
  batch<float,_xsimd::avx512bw> *in_stack_fffffffffffffa70;
  undefined1 auVar4 [28];
  undefined1 auVar7 [16];
  undefined1 in_stack_fffffffffffffac0 [64];
  undefined1 auVar5 [40];
  undefined1 auVar6 [52];
  batch<float,_xsimd::avx512bw> local_480;
  get_bool_simd_register_t<float,_xsimd::avx512bw> local_402;
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [3] [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  batch<float,_xsimd::avx512bw> local_1c0;
  get_bool_simd_register_t<float,_xsimd::avx512bw> local_142;
  batch<float,_xsimd::avx512bw> local_140;
  batch<float,_xsimd::avx512bw> *local_c8;
  
  local_c8 = in_RDI;
  abs<float,xsimd::avx512bw>(in_stack_fffffffffffffa70);
  auVar6 = in_stack_fffffffffffffac0._40_52_;
  batch<float,_xsimd::avx512bw>::batch
            (in_stack_fffffffffffffac0._32_8_,in_stack_fffffffffffffac0._28_4_);
  local_142.data = (register_type)operator>(&local_140,&local_1c0);
  auVar5 = auVar6._12_40_;
  batch<float,_xsimd::avx512bw>::batch(auVar6._4_8_,auVar6._0_4_);
  auVar4 = auVar5._12_28_;
  auVar2 = ZEXT464(0x3f000000);
  batch<float,_xsimd::avx512bw>::batch(auVar5._4_8_,auVar5._0_4_);
  fma<float,xsimd::avx512bw>
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  local_280 = auVar2;
  sqrt<float,xsimd::avx512bw>(in_stack_fffffffffffffa70);
  local_240 = auVar2;
  select<float,xsimd::avx512bw>
            ((batch_bool<float,_xsimd::avx512bw> *)in_stack_fffffffffffffa70,
             in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  auVar3 = ZEXT1664(auVar2._0_16_);
  local_200 = auVar2;
  memcpy(&local_140,local_200,0x40);
  asin<float,xsimd::avx512bw>(in_stack_fffffffffffffa70);
  auVar2 = ZEXT1664(auVar3._0_16_);
  local_340[0] = auVar3;
  memcpy(&local_140,local_340,0x40);
  xsimd::operator+(auVar4._8_8_,auVar4._0_8_);
  local_3c0 = auVar2;
  select<float,xsimd::avx512bw>
            ((batch_bool<float,_xsimd::avx512bw> *)in_stack_fffffffffffffa70,
             in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  local_380 = auVar2;
  memcpy(&local_140,local_380,0x40);
  auVar7 = auVar4._12_16_;
  auVar2 = ZEXT464(0xbf000000);
  batch<float,_xsimd::avx512bw>::batch(auVar4._4_8_,auVar4._0_4_);
  local_402.data = (register_type)xsimd::operator<(local_c8,&local_480);
  constants::pi<xsimd::batch<float,xsimd::avx512bw>>();
  xsimd::operator-(auVar7._8_8_,auVar7._0_8_);
  select<float,xsimd::avx512bw>
            ((batch_bool<float,_xsimd::avx512bw> *)in_stack_fffffffffffffa70,
             in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  local_400 = auVar2;
  memcpy(&local_140,local_400,0x40);
  constants::pio2<xsimd::batch<float,xsimd::avx512bw>>();
  xsimd::operator-(auVar7._8_8_,auVar7._0_8_);
  pbVar1 = select<float,xsimd::avx512bw>
                     ((batch_bool<float,_xsimd::avx512bw> *)in_stack_fffffffffffffa70,
                      in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  return pbVar1;
}

Assistant:

inline batch<T, A> acos(batch<T, A> const& self, requires_arch<generic>) noexcept
        {
            using batch_type = batch<T, A>;
            batch_type x = abs(self);
            auto x_larger_05 = x > batch_type(0.5);
            x = select(x_larger_05, sqrt(fma(batch_type(-0.5), x, batch_type(0.5))), self);
            x = asin(x);
            x = select(x_larger_05, x + x, x);
            x = select(self < batch_type(-0.5), constants::pi<batch_type>() - x, x);
            return select(x_larger_05, x, constants::pio2<batch_type>() - x);
        }